

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dxil_spirv_c.cpp
# Opt level: O0

dxil_spv_result
dxil_spv_parsed_blob_scan_resources
          (dxil_spv_parsed_blob blob,dxil_spv_srv_remapper_cb srv_remapper,
          dxil_spv_sampler_remapper_cb sampler_remapper,dxil_spv_cbv_remapper_cb cbv_remapper,
          dxil_spv_uav_remapper_cb uav_remapper,void *userdata)

{
  undefined1 local_c8 [8];
  Remapper remapper;
  void *userdata_local;
  dxil_spv_uav_remapper_cb uav_remapper_local;
  dxil_spv_cbv_remapper_cb cbv_remapper_local;
  dxil_spv_sampler_remapper_cb sampler_remapper_local;
  dxil_spv_srv_remapper_cb srv_remapper_local;
  dxil_spv_parsed_blob blob_local;
  
  remapper._136_8_ = userdata;
  Remapper::Remapper((Remapper *)local_c8);
  remapper.srv_remapper = (dxil_spv_srv_remapper_cb)remapper._136_8_;
  remapper.sampler_remapper = (dxil_spv_sampler_remapper_cb)remapper._136_8_;
  remapper.cbv_remapper = (dxil_spv_cbv_remapper_cb)remapper._136_8_;
  remapper.uav_remapper = (dxil_spv_uav_remapper_cb)remapper._136_8_;
  remapper.super_ResourceRemappingInterface._vptr_ResourceRemappingInterface =
       (_func_int **)srv_remapper;
  remapper.srv_userdata = sampler_remapper;
  remapper.sampler_userdata = uav_remapper;
  remapper.uav_userdata = cbv_remapper;
  dxil_spv::Converter::scan_resources((ResourceRemappingInterface *)local_c8,&blob->bc);
  Remapper::~Remapper((Remapper *)local_c8);
  return DXIL_SPV_SUCCESS;
}

Assistant:

dxil_spv_result dxil_spv_parsed_blob_scan_resources(dxil_spv_parsed_blob blob,
                                                    dxil_spv_srv_remapper_cb srv_remapper,
                                                    dxil_spv_sampler_remapper_cb sampler_remapper,
                                                    dxil_spv_cbv_remapper_cb cbv_remapper,
                                                    dxil_spv_uav_remapper_cb uav_remapper, void *userdata)
{
	Remapper remapper;
	remapper.srv_remapper = srv_remapper;
	remapper.srv_userdata = userdata;
	remapper.sampler_remapper = sampler_remapper;
	remapper.sampler_userdata = userdata;
	remapper.cbv_remapper = cbv_remapper;
	remapper.cbv_userdata = userdata;
	remapper.uav_remapper = uav_remapper;
	remapper.uav_userdata = userdata;

	Converter::scan_resources(&remapper, blob->bc);
	return DXIL_SPV_SUCCESS;
}